

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O3

trt_node * trop_read_node(trt_node *__return_storage_ptr__,trt_parent_cache ca,trt_tree_ctx *tc)

{
  ushort uVar1;
  ushort uVar2;
  lysp_node *plVar3;
  ly_bool lVar4;
  trt_iffeatures_type tVar5;
  lyplg_ext_sprinter_tree_node_override *plVar6;
  void *pvVar7;
  char *pcVar8;
  ushort uVar9;
  char *pcVar10;
  ulong uVar11;
  bool bVar12;
  trt_type tVar13;
  
  if (((tc == (trt_tree_ctx *)0x0) || (plVar3 = tc->pn, plVar3 == (lysp_node *)0x0)) ||
     (plVar3->nodetype == 0)) {
    __assert_fail("tc && tc->pn && tc->pn->nodetype != LYS_UNKNOWN",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                  ,0xb7b,
                  "struct trt_node trop_read_node(struct trt_parent_cache, struct trt_tree_ctx *)");
  }
  plVar6 = tro_set_node_overr(tc->lysc_tree,plVar3,'\x01',&tc->plugin_ctx);
  plVar3 = tc->pn;
  (__return_storage_ptr__->name).type = TRD_NODE_ELSE;
  (__return_storage_ptr__->name).keys = '\0';
  *(undefined3 *)&(__return_storage_ptr__->name).field_0x5 = 0;
  (__return_storage_ptr__->name).module_prefix = (char *)0x0;
  (__return_storage_ptr__->name).str = (char *)0x0;
  (__return_storage_ptr__->name).add_opts = (char *)0x0;
  (__return_storage_ptr__->name).opts = (char *)0x0;
  uVar1 = plVar3->nodetype;
  uVar2 = plVar3->flags;
  uVar11 = (ulong)uVar2;
  uVar9 = ca.lys_status;
  if ((uVar1 & 0x3000) == 0) {
    if ((uVar2 & 0x1c) != 0) {
      uVar9 = uVar2;
    }
    if ((ca._0_8_ >> 0x20 & 0x18) == 0) {
      uVar9 = uVar2;
    }
  }
  pcVar10 = "x";
  if ((uVar9 & 8) == 0) {
    pcVar10 = "+";
  }
  pcVar8 = "o";
  if ((uVar9 & 0x10) == 0) {
    pcVar8 = pcVar10;
  }
  __return_storage_ptr__->status = pcVar8;
  if ((plVar6 == (lyplg_ext_sprinter_tree_node_override *)0x0) ||
     (pcVar10 = plVar6->flags, plVar6->flags == (char *)0x0)) {
    pcVar10 = "-w";
    if (((ca.ancestor != TRD_ANCESTOR_RPC_INPUT) &&
        (((uVar1 & 0x1000) == 0 &&
         (pcVar10 = "ro", (ca.ancestor & ~TRD_ANCESTOR_RPC_INPUT) != TRD_ANCESTOR_RPC_OUTPUT)))) &&
       ((uVar1 & 0x2000) == 0)) {
      if ((uVar1 >> 10 & 1) == 0) {
        if ((uVar1 >> 0xb & 1) == 0) {
          if ((uVar1 & 0x300) == 0) {
            if ((uVar2 & 3) == 0) {
              uVar11 = ca._0_8_ >> 0x30;
              pcVar8 = "rw";
              if ((uVar11 & 1) == 0) {
                pcVar8 = "--";
              }
            }
            else {
              pcVar8 = "rw";
              if ((uVar2 & 1) == 0) {
                pcVar8 = "--";
              }
            }
            pcVar10 = "ro";
            if ((uVar11 & 2) == 0) {
              pcVar10 = pcVar8;
            }
          }
          else {
            pcVar10 = "-x";
          }
        }
        else {
          pcVar10 = "-u";
        }
      }
      else {
        pcVar10 = "-n";
      }
    }
  }
  __return_storage_ptr__->flags = pcVar10;
  if ((uVar1 & 0x3000) != 0) goto LAB_00197856;
  if ((char)uVar1 < '\0') {
    (__return_storage_ptr__->name).type = TRD_NODE_CASE;
    goto LAB_00197856;
  }
  if ((uVar1 & 2) == 0) {
    if ((((uVar1 & 1) == 0) || (plVar3[1].next == (lysp_node *)0x0)) ||
       (*(char *)&(plVar3[1].next)->parent == '\0')) {
      if ((uVar1 & 0x18) == 0) {
        if ((((uVar1 & 0x60) == 0) || ((uVar2 & 0x20) != 0)) &&
           (((uVar1 & 4) == 0 ||
            (((uVar2 & 0x20) != 0 || (lVar4 = trop_leaf_is_key(plVar3,ca.last_list), lVar4 != '\0'))
            )))) goto LAB_00197856;
        goto LAB_0019784b;
      }
      pcVar10 = "*";
    }
    else {
      pcVar10 = "!";
    }
  }
  else {
    (__return_storage_ptr__->name).type = TRD_NODE_CHOICE;
    if ((uVar2 & 0x20) != 0) goto LAB_00197856;
LAB_0019784b:
    pcVar10 = "?";
  }
  (__return_storage_ptr__->name).opts = pcVar10;
LAB_00197856:
  if (plVar6 == (lyplg_ext_sprinter_tree_node_override *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    pcVar10 = plVar6->add_opts;
  }
  (__return_storage_ptr__->name).add_opts = pcVar10;
  if (((uVar1 & 0x10) == 0) || (plVar3[1].next == (lysp_node *)0x0)) {
    bVar12 = false;
  }
  else {
    bVar12 = *(char *)&(plVar3[1].next)->parent != '\0';
  }
  (__return_storage_ptr__->name).keys = bVar12;
  (__return_storage_ptr__->name).module_prefix = (char *)0x0;
  (__return_storage_ptr__->name).str = plVar3->name;
  tVar13 = trop_resolve_type(plVar3);
  (__return_storage_ptr__->type).type = tVar13.type;
  (__return_storage_ptr__->type).str = tVar13.str;
  if ((plVar3->iffeatures == (lysp_qname *)0x0) ||
     (tVar5 = TRD_IFF_PRESENT, *(long *)&plVar3->iffeatures[-1].flags == 0)) {
    tVar5 = TRD_IFF_NON_PRESENT;
  }
  (__return_storage_ptr__->iffeatures).type = tVar5;
  (__return_storage_ptr__->iffeatures).str = (char *)0x0;
  pvVar7 = tro_next_sibling(plVar3,tc);
  __return_storage_ptr__->last_one = pvVar7 == (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static struct trt_node
trop_read_node(struct trt_parent_cache ca, struct trt_tree_ctx *tc)
{
    const struct lysp_node *pn;
    struct trt_node ret;
    struct lyplg_ext_sprinter_tree_node_override *no;

    assert(tc && tc->pn && tc->pn->nodetype != LYS_UNKNOWN);

    no = tro_set_node_overr(tc->lysc_tree, tc->pn, 1, &tc->plugin_ctx);

    pn = tc->pn;
    ret = TRP_EMPTY_NODE;

    /* <status> */
    ret.status = trop_resolve_status(pn->nodetype, pn->flags, ca.lys_status);

    /* <flags> */
    ret.flags = trop_resolve_flags(pn->nodetype, pn->flags, ca.ancestor, ca.lys_config, no);

    /* set type of the node */
    trop_resolve_node_opts(pn, ca.last_list, &ret.name.type, &ret.name.opts);
    ret.name.add_opts = no && no->add_opts ? no->add_opts : NULL;
    ret.name.keys = (tc->pn->nodetype & LYS_LIST) && trop_list_has_keys(tc->pn);

    /* The parsed tree is not compiled, so no node can be augmented
     * from another module. This means that nodes from the parsed tree
     * will never have the prefix.
     */
    ret.name.module_prefix = NULL;

    /* set node's name */
    ret.name.str = pn->name;

    /* <type> */
    ret.type = trop_resolve_type(pn);

    /* <iffeature> */
    ret.iffeatures = trop_resolve_iffeatures(pn);

    ret.last_one = !tro_next_sibling(pn, tc);

    return ret;
}